

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

iterator __thiscall
QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::find
          (QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *this,GestureType *key)

{
  iterator iVar1;
  long in_FS_OFFSET;
  QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>_>
  local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>_*>
        )(this->d).d.ptr;
  if ((local_20.d.ptr ==
       (QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
        *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(((QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
           *)local_20.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x1)) {
    local_20.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>_*>
          )(QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
            *)0x0;
  }
  else {
    LOCK();
    (((QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
       *)local_20.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
                        *)local_20.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  detach(this);
  iVar1 = std::
          _Rb_tree<Qt::GestureType,_std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>,_std::_Select1st<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>
          ::find(&(((this->d).d.ptr)->m)._M_t,key);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (iterator)(iterator)iVar1._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator find(const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        return iterator(d->m.find(key));
    }